

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecHsh.h
# Opt level: O0

int Hsh_IntManHash(uint *pData,int nSize,int nTableSize)

{
  uint uVar1;
  uchar *pDataC;
  uint hash;
  int i;
  int nTableSize_local;
  int nSize_local;
  uint *pData_local;
  
  pDataC._0_4_ = 0;
  for (pDataC._4_4_ = 0; pDataC._4_4_ != nSize << 2; pDataC._4_4_ = pDataC._4_4_ + 1) {
    uVar1 = (*(byte *)((long)pData + (long)pDataC._4_4_) + (uint)pDataC) * 0x401;
    pDataC._0_4_ = uVar1 >> 6 ^ uVar1;
  }
  return (((uint)pDataC * 9 >> 0xb ^ (uint)pDataC * 9) * 0x8001) % (uint)nTableSize;
}

Assistant:

static inline int Hsh_IntManHash( unsigned * pData, int nSize, int nTableSize ) 
{
    int i = 0; unsigned hash = 0;
    unsigned char * pDataC = (unsigned char *)pData;
    nSize <<= 2;
    while ( i != nSize ) 
    {
        hash += pDataC[i++];
        hash += hash << 10;
        hash ^= hash >> 6;
    }
    hash += hash << 3;
    hash ^= hash >> 11;
    hash += hash << 15;
    return (int)(hash % nTableSize);
}